

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O1

void __thiscall iDynTree::SensorsList::destructor(SensorsList *this)

{
  pointer pvVar1;
  SensorsListPimpl *this_00;
  pointer ppSVar2;
  ulong uVar3;
  int sensor_type;
  long lVar4;
  
  lVar4 = 0;
  do {
    pvVar1 = (this->pimpl->allSensors).
             super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppSVar2 = *(pointer *)
               &pvVar1[lVar4].
                super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>._M_impl;
    if (pvVar1[lVar4].super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
      uVar3 = 0;
      do {
        if (ppSVar2[uVar3] != (Sensor *)0x0) {
          (*ppSVar2[uVar3]->_vptr_Sensor[1])();
        }
        uVar3 = uVar3 + 1;
        pvVar1 = (this->pimpl->allSensors).
                 super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppSVar2 = *(pointer *)
                   &pvVar1[lVar4].
                    super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                    _M_impl;
      } while (uVar3 < (ulong)((long)pvVar1[lVar4].
                                     super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3
                              ));
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  std::
  vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  ::resize(&this->pimpl->allSensors,0);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
  ::resize(&this->pimpl->sensorsNameToIndex,0);
  this_00 = this->pimpl;
  if (this_00 != (SensorsListPimpl *)0x0) {
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
    ::~vector(&this_00->sensorsNameToIndex);
    std::
    vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
    ::~vector(&this_00->allSensors);
    operator_delete(this_00,0x30);
  }
  this->pimpl = (SensorsListPimpl *)0x0;
  return;
}

Assistant:

void SensorsList::destructor()
{
    for( int sensor_type = 0; sensor_type < NR_OF_SENSOR_TYPES; sensor_type++ )
    {
        for(size_t sensor_index = 0;
            sensor_index < this->pimpl->allSensors[sensor_type].size(); sensor_index++ )
        {
            delete this->pimpl->allSensors[sensor_type][sensor_index];
        }
    }
    this->pimpl->allSensors.resize(0);
    this->pimpl->sensorsNameToIndex.resize(0);

    delete this->pimpl;
    this->pimpl = 0;
}